

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_get.c
# Opt level: O0

int mpt_message_get(mpt_queue *qu,size_t off,size_t take,mpt_message *msg,iovec *vec)

{
  void *pvVar1;
  ulong uVar2;
  int *piVar3;
  size_t len;
  size_t high;
  size_t low;
  uint8_t *base;
  iovec *vec_local;
  mpt_message *msg_local;
  size_t take_local;
  size_t off_local;
  mpt_queue *qu_local;
  
  base = (uint8_t *)vec;
  vec_local = (iovec *)msg;
  msg_local = (mpt_message *)take;
  take_local = off;
  off_local = (size_t)qu;
  pvVar1 = mpt_queue_data(qu,&high);
  len = *(long *)(off_local + 8) - high;
  if (take_local < high) {
    low = take_local + (long)pvVar1;
    high = high - take_local;
  }
  else {
    uVar2 = take_local - high;
    low = *(long *)off_local + uVar2;
    if (len < uVar2) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      return -1;
    }
    high = len - uVar2;
    len = 0;
  }
  if ((mpt_message *)(high + len) < msg_local) {
    piVar3 = __errno_location();
    *piVar3 = 0x22;
    qu_local._4_4_ = -2;
  }
  else if (high < msg_local) {
    if (base == (uint8_t *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      qu_local._4_4_ = -3;
    }
    else {
      vec_local->iov_len = low;
      vec_local->iov_base = (void *)high;
      vec_local[1].iov_len = 1;
      vec_local[1].iov_base = base;
      *(undefined8 *)base = *(undefined8 *)off_local;
      *(size_t *)(base + 8) = (long)msg_local - high;
      qu_local._4_4_ = 1;
    }
  }
  else {
    vec_local->iov_len = low;
    vec_local->iov_base = msg_local;
    vec_local[1].iov_len = 0;
    qu_local._4_4_ = 0;
  }
  return qu_local._4_4_;
}

Assistant:

extern int mpt_message_get(const MPT_STRUCT(queue) *qu, size_t off, size_t take, MPT_STRUCT(message) *msg, struct iovec *vec)
{
	uint8_t *base;
	size_t low, high, len;
	
	base = mpt_queue_data(qu, &low);
	high = qu->len - low;
	
	if (off < low) {
		base += off;
		low  -= off;
	}
	else {
		len = off - low;
		base = ((uint8_t *) qu->base) + len;
		if (len > high) {
			errno = EINVAL;
			return -1;
		}
		low  = high - len;
		high = 0;
	}
	if (take > (len = low + high)) {
		errno = ERANGE;
		return -2;
	}
	if (take <= low) {
		msg->base = base;
		msg->used = take;
		msg->clen = 0;
		return 0;
	}
	else if (!vec) {
		errno = EINVAL;
		return -3;
	}
	else {
		msg->base = base;
		msg->used = low;
		msg->clen = 1;
		msg->cont = vec;
		vec->iov_base = qu->base;
		vec->iov_len  = take - low;
		return 1;
	}
}